

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

char * ImAtoi<long_long>(char *src,longlong *output)

{
  char cVar1;
  undefined7 in_register_00000001;
  char cVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  
  cVar1 = *src;
  uVar4 = (ulong)(cVar1 == '-');
  cVar2 = src[(src[uVar4] == '+') + uVar4];
  if ((byte)(cVar2 - 0x30U) < 10) {
    pcVar6 = src + (src[uVar4] == '+') + uVar4;
    lVar5 = 0;
    do {
      pcVar6 = pcVar6 + 1;
      lVar5 = (ulong)(byte)(cVar2 - 0x30) + lVar5 * 10;
      cVar2 = *pcVar6;
    } while ((byte)(cVar2 - 0x30U) < 10);
  }
  else {
    lVar5 = 0;
  }
  lVar3 = -lVar5;
  if (cVar1 != '-') {
    lVar3 = lVar5;
  }
  *output = lVar3;
  return (char *)CONCAT71(in_register_00000001,cVar1);
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}